

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

int lyv_data_context(lyd_node *node,int options,unres_data *unres)

{
  ly_ctx *ctx_00;
  int iVar1;
  lys_node *plVar2;
  lys_module *plVar3;
  bool bVar4;
  ly_ctx *ctx;
  lyd_node_leaf_list *leaf;
  lys_node *sparent;
  lys_node *siter;
  unres_data *unres_local;
  int options_local;
  lyd_node *node_local;
  
  ctx_00 = node->schema->module->ctx;
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x3b,"int lyv_data_context(const struct lyd_node *, int, struct unres_data *)");
  }
  if (unres != (unres_data *)0x0) {
    plVar2 = lys_is_disabled(node->schema,2);
    if (plVar2 != (lys_node *)0x0) {
      ly_vlog(ctx_00,LYE_INELEM,LY_VLOG_LYD,node,node->schema->name);
      return 1;
    }
    if ((options & 0x8eU) == 0) {
      if ((node->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
        if ((*(int *)&node->schema[1].ref == 0xb) && (*(int *)&node->schema[1].field_0x3c != 0)) {
          iVar1 = unres_data_add(unres,node,UNRES_UNION);
          if (iVar1 != 0) {
            return 1;
          }
        }
        else if ((*(int *)&node->schema[1].ref == 9) &&
                (((node->validity & 8) != 0 || (((ulong)node[1].schema & 0x100000000) != 0)))) {
          *(byte *)((long)&node[1].schema + 4) = *(byte *)((long)&node[1].schema + 4) & 0xfe;
          node->validity = node->validity | 8;
          iVar1 = unres_data_add(unres,node,UNRES_LEAFREF);
          if (iVar1 != 0) {
            return 1;
          }
        }
        else if ((*(int *)&node->schema[1].ref == 8) &&
                (iVar1 = unres_data_add(unres,node,UNRES_INSTID), iVar1 != 0)) {
          return 1;
        }
      }
      if ((((byte)node->field_0x9 >> 1 & 4) != 0) &&
         (iVar1 = unres_data_add(unres,node,UNRES_WHEN), iVar1 != 0)) {
        return 1;
      }
    }
    else if ((node->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
      node->validity = node->validity & 0xf7;
    }
    if (((options & 0xdU) == 0) || ((node->schema->flags & 2) == 0)) {
      if ((((options & 0x2080U) == 0) &&
          ((((node->validity & 4) != 0 && (iVar1 = lyp_is_rpc_action(node->schema), iVar1 != 0)) &&
           (node->prev != node)))) && (node->prev->next != (lyd_node *)0x0)) {
        leaf = (lyd_node_leaf_list *)lys_parent(node->schema);
        while( true ) {
          bVar4 = false;
          if (leaf != (lyd_node_leaf_list *)0x0) {
            bVar4 = ((ulong)leaf->value_str & 0x1042) != 0;
          }
          if (!bVar4) break;
          leaf = (lyd_node_leaf_list *)lys_parent((lys_node *)leaf);
        }
        plVar2 = node->schema;
        plVar3 = lyd_node_module(node);
        for (sparent = lys_getnext(plVar2,(lys_node *)leaf,plVar3,0); sparent != (lys_node *)0x0;
            sparent = lys_getnext(sparent,(lys_node *)leaf,plVar3,0)) {
          if (sparent == node->prev->schema) {
            ly_vlog(ctx_00,LYE_INORDER,LY_VLOG_LYD,node,node->schema->name,sparent->name);
            return 1;
          }
          plVar3 = lyd_node_module(node);
        }
      }
      node_local._4_4_ = 0;
    }
    else {
      ly_vlog(ctx_00,LYE_INELEM,LY_VLOG_LYD,node,node->schema->name);
      node_local._4_4_ = 1;
    }
    return node_local._4_4_;
  }
  __assert_fail("unres",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                ,0x3c,"int lyv_data_context(const struct lyd_node *, int, struct unres_data *)");
}

Assistant:

int
lyv_data_context(const struct lyd_node *node, int options, struct unres_data *unres)
{
    const struct lys_node *siter = NULL;
    struct lys_node *sparent;
    struct lyd_node_leaf_list *leaf = (struct lyd_node_leaf_list *)node;
    struct ly_ctx *ctx = node->schema->module->ctx;

    assert(node);
    assert(unres);

    /* check if the node instance is enabled by if-feature */
    if (lys_is_disabled(node->schema, 2)) {
        LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, node, node->schema->name);
        return 1;
    }

    if (!(options & (LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
        if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            /* if union with leafref/intsid, leafref itself (invalid) or instance-identifier, store the node for later resolving */
            if ((((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_UNION)
                    && ((struct lys_node_leaf *)leaf->schema)->type.info.uni.has_ptr_type) {
                if (unres_data_add(unres, (struct lyd_node *)node, UNRES_UNION)) {
                    return 1;
                }
            } else if ((((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_LEAFREF)
                    && ((leaf->validity & LYD_VAL_LEAFREF) || (leaf->value_flags & LY_VALUE_UNRES))) {
                /* always retry validation on unres leafrefs, if again not possible, the correct flags should
                 * be set and the leafref will be kept unresolved */
                leaf->value_flags &= ~LY_VALUE_UNRES;
                leaf->validity |= LYD_VAL_LEAFREF;

                if (unres_data_add(unres, (struct lyd_node *)node, UNRES_LEAFREF)) {
                    return 1;
                }
            } else if (((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_INST) {
                if (unres_data_add(unres, (struct lyd_node *)node, UNRES_INSTID)) {
                    return 1;
                }
            }
        }

        /* check all relevant when conditions */
        if (node->when_status & LYD_WHEN) {
            if (unres_data_add(unres, (struct lyd_node *)node, UNRES_WHEN)) {
                return 1;
            }
        }
    } else if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* just remove the flag if it was set */
        leaf->validity &= ~LYD_VAL_LEAFREF;
    }

    /* check for (non-)presence of status data in edit-config data */
    if ((options & (LYD_OPT_EDIT | LYD_OPT_GETCONFIG | LYD_OPT_CONFIG)) && (node->schema->flags & LYS_CONFIG_R)) {
        LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, node, node->schema->name);
        return 1;
    }

    /* check elements order in case of RPC's input and output */
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER)) && (node->validity & LYD_VAL_MAND) && lyp_is_rpc_action(node->schema)) {
        if ((node->prev != node) && node->prev->next) {
            /* find schema data parent */
            for (sparent = lys_parent(node->schema);
                    sparent && (sparent->nodetype & (LYS_USES | LYS_CHOICE | LYS_CASE));
                    sparent = lys_parent(sparent));
            for (siter = lys_getnext(node->schema, sparent, lyd_node_module(node), 0);
                    siter;
                    siter = lys_getnext(siter, sparent, lyd_node_module(node), 0)) {
                if (siter == node->prev->schema) {
                    /* data predecessor has the schema node after
                     * the schema node of the data node being checked */
                    LOGVAL(ctx, LYE_INORDER, LY_VLOG_LYD, node, node->schema->name, siter->name);
                    return 1;
                }
            }

        }
    }

    return 0;
}